

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

Entry * __thiscall
Lib::
DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
findEntryToInsert(DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *this,pair<unsigned_int,_unsigned_int> *key)

{
  uint uVar1;
  Entry *pEVar2;
  ulong uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  
  if (this->_nextExpansionOccupancy <= this->_deleted + this->_size) {
    expand(this);
  }
  uVar1 = DefaultHash::hash<unsigned_int,unsigned_int>(key);
  uVar3 = (ulong)uVar1 % (ulong)(uint)this->_capacity;
  pEVar2 = this->_entries + (int)uVar3;
  uVar1 = (uint)(pEVar2->field_0)._infoData >> 2;
  if ((uVar1 == this->_timestamp) &&
     (iVar6 = -(uint)((*key).first == (pEVar2->_key).first),
     iVar7 = -(uint)((*key).second == (pEVar2->_key).second), auVar5._4_4_ = iVar6,
     auVar5._0_4_ = iVar6, auVar5._8_4_ = iVar7, auVar5._12_4_ = iVar7,
     iVar6 = movmskpd(uVar1,auVar5), iVar6 != 3)) {
    (pEVar2->field_0)._infoData = (pEVar2->field_0)._infoData | 2;
    uVar1 = key->first;
    uVar4 = (uVar1 * 0x40 + key->second + (uVar1 >> 2) + 0x9e3779b9 ^ uVar1) % (uint)this->_capacity
    ;
    do {
      uVar3 = (ulong)((int)uVar3 + uVar4 + (uVar4 == 0)) % (ulong)(uint)this->_capacity;
      pEVar2 = this->_entries + (int)uVar3;
      if ((uint)(pEVar2->field_0)._infoData >> 2 != this->_timestamp) {
        return pEVar2;
      }
    } while (((pEVar2->_key).first != uVar1) || ((pEVar2->_key).second != key->second));
  }
  return pEVar2;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }